

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  Ch *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong i;
  long lVar6;
  double *pdVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  byte bVar12;
  uint uVar13;
  byte *pbVar14;
  byte *pbVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pbVar14 = (byte *)is->src_;
  bVar1 = *pbVar14;
  bVar12 = bVar1;
  if (bVar1 == 0x2d) {
    pbVar15 = pbVar14 + 1;
    pbVar14 = pbVar14 + 1;
    bVar12 = *pbVar15;
  }
  pCVar2 = is->head_;
  if (bVar12 == 0x30) {
    bVar12 = pbVar14[1];
    pbVar14 = pbVar14 + 1;
    dVar16 = 0.0;
    bVar5 = false;
    bVar4 = false;
    iVar8 = 0;
    i = 0;
    bVar3 = false;
    uVar13 = 0;
    goto LAB_0011b9b7;
  }
  if ((byte)(bVar12 - 0x31) < 9) {
    uVar13 = bVar12 - 0x30;
    bVar12 = pbVar14[1];
    pbVar14 = pbVar14 + 1;
    dVar16 = 0.0;
    if (bVar1 == 0x2d) {
      if ((byte)(bVar12 - 0x30) < 10) {
        iVar8 = 0;
LAB_0011b912:
        if (uVar13 < 0xccccccc) {
LAB_0011b92a:
          uVar13 = ((uint)bVar12 + uVar13 * 10) - 0x30;
          iVar8 = iVar8 + 1;
          bVar12 = pbVar14[1];
          pbVar14 = pbVar14 + 1;
          if (9 < (byte)(bVar12 - 0x30)) goto LAB_0011b9b2;
          goto LAB_0011b912;
        }
        if (uVar13 != 0xccccccc) goto LAB_0011bdb9;
        if (bVar12 < 0x39) goto LAB_0011b92a;
        uVar13 = 0xccccccc;
        bVar12 = 0x39;
LAB_0011bdb9:
        i = (ulong)uVar13;
        if (bVar1 == 0x2d) {
          do {
            if ((0xccccccccccccccb < i) && ((i != 0xccccccccccccccc || (0x38 < bVar12))))
            goto LAB_0011be64;
            i = (ulong)(bVar12 & 0xf) + i * 10;
            iVar8 = iVar8 + 1;
            bVar12 = pbVar14[1];
            pbVar14 = pbVar14 + 1;
          } while ((byte)(bVar12 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < i) && ((i != 0x1999999999999999 || (0x35 < bVar12))))
            goto LAB_0011be64;
            i = (ulong)(bVar12 & 0xf) + i * 10;
            iVar8 = iVar8 + 1;
            bVar12 = pbVar14[1];
            pbVar14 = pbVar14 + 1;
          } while ((byte)(bVar12 - 0x30) < 10);
        }
        bVar5 = false;
        dVar16 = 0.0;
        bVar3 = true;
        bVar4 = false;
        goto LAB_0011b9b7;
      }
LAB_0011b9ab:
      iVar8 = 0;
    }
    else {
      if (9 < (byte)(bVar12 - 0x30)) goto LAB_0011b9ab;
      iVar8 = 0;
      do {
        if (0x19999998 < uVar13) {
          if (uVar13 != 0x19999999) goto LAB_0011bdb9;
          if (0x35 < bVar12) {
            uVar13 = 0x19999999;
            goto LAB_0011bdb9;
          }
        }
        uVar13 = ((uint)bVar12 + uVar13 * 10) - 0x30;
        iVar8 = iVar8 + 1;
        bVar12 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
      } while ((byte)(bVar12 - 0x30) < 10);
    }
LAB_0011b9b2:
    bVar4 = false;
    bVar5 = false;
    i = 0;
    bVar3 = false;
    goto LAB_0011b9b7;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x335,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar6 = (long)pbVar14 - (long)pCVar2;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0011bd28;
LAB_0011bb2f:
  do {
    pbVar15 = pbVar14 + 1;
    pbVar14 = pbVar14 + 1;
  } while ((byte)(*pbVar15 - 0x30) < 10);
LAB_0011bc54:
  iVar8 = -iVar9;
  if (!bVar5) {
    iVar8 = iVar9;
  }
LAB_0011bc61:
  if (bVar4) {
LAB_0011bc66:
    uVar13 = iVar8 + iVar11;
    if ((int)uVar13 < -0x134) {
      dVar17 = 0.0;
      if (0xfffffd97 < uVar13) {
        dVar17 = (dVar16 / 1e+308) /
                 *(double *)(internal::Pow10(int)::e + (ulong)(-uVar13 - 0x134) * 8);
      }
    }
    else if ((int)uVar13 < 0) {
      dVar17 = dVar16 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar13 * 8);
    }
    else {
      if (0x134 < uVar13) {
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      dVar17 = dVar16 * *(double *)(internal::Pow10(int)::e + (ulong)uVar13 * 8);
    }
    if (bVar1 == 0x2d) {
      dVar17 = -dVar17;
    }
    pdVar7 = (double *)(handler->stack_).stackTop_;
    if ((handler->stack_).stackEnd_ <= pdVar7 + 3) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
      pdVar7 = (double *)(handler->stack_).stackTop_;
    }
    (handler->stack_).stackTop_ = (char *)(pdVar7 + 3);
    pdVar7[1] = 0.0;
    *(undefined4 *)(pdVar7 + 2) = 0x4206;
    *pdVar7 = dVar17;
    goto LAB_0011bd94;
  }
  if (bVar3) {
    if (bVar1 == 0x2d) {
      bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar1 == 0x2d) {
    bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-uVar13);
  }
  else {
    bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,uVar13);
  }
  if (bVar5 != false) goto LAB_0011bd94;
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x3d6,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar6 = (long)pbVar14 - (long)pCVar2;
  *(undefined4 *)(this + 0x30) = 0x10;
  goto LAB_0011bd28;
LAB_0011be64:
  auVar20._8_4_ = (int)(i >> 0x20);
  auVar20._0_8_ = i;
  auVar20._12_4_ = 0x45300000;
  dVar16 = (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  lVar6 = (long)pbVar14 - (long)pCVar2;
  do {
    if (1.7976931348623158e+307 <= dVar16) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x357,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar6;
      goto LAB_0011bd94;
    }
    dVar16 = dVar16 * 10.0 + (double)(int)(bVar12 - 0x30);
    bVar12 = pbVar14[1];
    pbVar14 = pbVar14 + 1;
    lVar6 = lVar6 + 1;
    bVar5 = true;
  } while ((byte)(bVar12 - 0x30) < 10);
  bVar4 = true;
  bVar3 = true;
LAB_0011b9b7:
  if (bVar12 == 0x2e) {
    bVar12 = pbVar14[1];
    pbVar14 = pbVar14 + 1;
    if (9 < (byte)(bVar12 - 0x30)) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x364,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar6 = (long)pbVar14 - (long)pCVar2;
      *(undefined4 *)(this + 0x30) = 0xe;
      goto LAB_0011bd28;
    }
    iVar11 = 0;
    pbVar15 = pbVar14;
    if (bVar5) {
LAB_0011bc0e:
      do {
        pbVar14 = pbVar15;
        if (0x39 < bVar12) goto LAB_0011ba4f;
        if (iVar8 < 0x11) {
          dVar16 = dVar16 * 10.0 + (double)(int)(bVar12 - 0x30);
          iVar11 = iVar11 + -1;
          if (0.0 < dVar16) {
            iVar8 = iVar8 + 1;
          }
        }
        bVar12 = pbVar15[1];
        pbVar14 = pbVar15 + 1;
        pbVar15 = pbVar14;
      } while ('/' < (char)bVar12);
      iVar8 = 0;
      goto LAB_0011bc61;
    }
    if (!bVar3) {
      i = (ulong)uVar13;
    }
    iVar11 = 0;
    do {
      if ((0x39 < bVar12) || (i >> 0x35 != 0)) {
        auVar19._8_4_ = (int)(i >> 0x20);
        auVar19._0_8_ = i;
        auVar19._12_4_ = 0x45300000;
        dVar16 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
        bVar4 = true;
        goto LAB_0011bc0e;
      }
      pbVar14 = pbVar15 + 1;
      iVar11 = iVar11 + -1;
      i = (ulong)(bVar12 - 0x30) + i * 10;
      iVar8 = iVar8 + (uint)(i != 0);
      bVar12 = pbVar15[1];
      pbVar15 = pbVar14;
    } while ('/' < (char)bVar12);
    dVar16 = (double)(long)i;
    iVar8 = 0;
    goto LAB_0011bc66;
  }
  iVar11 = 0;
LAB_0011ba4f:
  iVar8 = 0;
  if ((bVar12 | 0x20) != 0x65) goto LAB_0011bc61;
  uVar10 = (ulong)uVar13;
  if (bVar3) {
    uVar10 = i;
  }
  if (!bVar4) {
    auVar18._8_4_ = (int)(uVar10 >> 0x20);
    auVar18._0_8_ = uVar10;
    auVar18._12_4_ = 0x45300000;
    dVar16 = (auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
    bVar4 = true;
  }
  bVar12 = pbVar14[1];
  if (bVar12 == 0x2b) {
    bVar5 = false;
LAB_0011bad5:
    pbVar15 = pbVar14 + 2;
    if ((byte)(*pbVar15 - 0x30) < 10) {
      pbVar14 = pbVar14 + 3;
      iVar9 = *pbVar15 - 0x30;
      if (bVar5) {
        bVar12 = *pbVar14;
        if ((byte)(bVar12 - 0x30) < 10) {
          do {
            iVar9 = (uint)bVar12 + iVar9 * 10 + -0x30;
            if (0xccccccb < iVar9) goto LAB_0011bb2f;
            pbVar14 = pbVar14 + 1;
            bVar12 = *pbVar14;
          } while ((byte)(bVar12 - 0x30) < 10);
        }
        else {
          bVar5 = true;
        }
        goto LAB_0011bc54;
      }
LAB_0011bb66:
      lVar6 = (long)pbVar14 - (long)pCVar2;
      do {
        bVar12 = *pbVar14;
        if (9 < (byte)(bVar12 - 0x30)) {
          bVar5 = false;
          goto LAB_0011bc54;
        }
        pbVar14 = pbVar14 + 1;
        iVar9 = (bVar12 - 0x30) + iVar9 * 10;
        lVar6 = lVar6 + 1;
      } while (iVar9 <= 0x134 - iVar11);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3ae,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar6;
      goto LAB_0011bd94;
    }
    pbVar14 = pbVar14 + 2;
  }
  else {
    if (bVar12 == 0x2d) {
      bVar5 = true;
      goto LAB_0011bad5;
    }
    if ((byte)(bVar12 - 0x30) < 10) {
      pbVar14 = pbVar14 + 2;
      iVar9 = bVar12 - 0x30;
      goto LAB_0011bb66;
    }
    pbVar14 = pbVar14 + 1;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x3b3,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar6 = (long)pbVar14 - (long)pCVar2;
  *(undefined4 *)(this + 0x30) = 0xf;
LAB_0011bd28:
  *(long *)(this + 0x38) = lVar6;
LAB_0011bd94:
  is->src_ = (Ch *)pbVar14;
  is->head_ = pCVar2;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, (parseFlags & kParseFullPrecisionFlag) != 0> s(*this, copy.s);

        // Parse minus
        bool minus = false;
        if (s.Peek() == '-') {
            minus = true;
            s.Take();
        }

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (s.Peek() == '0') {
            i = 0;
            s.TakePush();
        }
        else if (s.Peek() >= '1' && s.Peek() <= '9') {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 214748364) { // 2^31 = 2147483648
                        if (i != 214748364 || s.Peek() > '8') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 429496729) { // 2^32 - 1 = 4294967295
                        if (i != 429496729 || s.Peek() > '5') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        double d = 0.0;
        if (use64bit) {
            if (minus) 
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                     if (i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC)) // 2^63 = 9223372036854775808
                        if (i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                    if (i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999)) // 2^64 - 1 = 18446744073709551615
                        if (i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (d >= 1.7976931348623157e307) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (s.Peek() == '.') {
            s.Take();
            decimalPosition = s.Length();

            if (!(s.Peek() >= '0' && s.Peek() <= '9'))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;
        
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = (double)i64;
#else
                // Use double to store significand in 32-bit architecture
                d = use64bit ? (double)i64 : (double)i;
#endif
                useDouble = true;
            }

            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (d > 0.0)
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (s.Peek() == 'e' || s.Peek() == 'E') {
            if (!useDouble) {
                d = use64bit ? i64 : i;
                useDouble = true;
            }
            s.Take();

            bool expMinus = false;
            if (s.Peek() == '+')
                s.Take();
            else if (s.Peek() == '-') {
                s.Take();
                expMinus = true;
            }

            if (s.Peek() >= '0' && s.Peek() <= '9') {
                exp = s.Take() - '0';
                if (expMinus) {
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (s.Peek() >= '0' && s.Peek() <= '9')  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp > maxExp)
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;
        size_t length = s.Length();
        const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

        if (useDouble) {
            int p = exp + expFrac;
            if (parseFlags & kParseFullPrecisionFlag)
                d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
            else
                d = internal::StrtodNormalPrecision(d, p);

            cont = handler.Double(minus ? -d : d);
        }
        else {
            if (use64bit) {
                if (minus)
                    cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                else
                    cont = handler.Uint64(i64);
            }
            else {
                if (minus)
                    cont = handler.Int(static_cast<int32_t>(~i + 1));
                else
                    cont = handler.Uint(i);
            }
        }
        if (!cont)
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }